

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

void al_set_new_file_interface(ALLEGRO_FILE_INTERFACE *file_interface)

{
  thread_local_state *ptVar1;
  
  ptVar1 = tls_get();
  if (ptVar1 != (thread_local_state *)0x0) {
    ptVar1->new_file_interface = file_interface;
  }
  return;
}

Assistant:

void al_set_new_file_interface(const ALLEGRO_FILE_INTERFACE *file_interface)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return;
   tls->new_file_interface = file_interface;
}